

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::UTF8CharactersTest::prepareShaderSource
          (UTF8CharactersTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  CASES CVar1;
  pointer psVar2;
  bool *pbVar3;
  TestError *this_00;
  char *pcVar4;
  char *pcVar5;
  bool *text;
  size_t position;
  bool *local_50;
  bool *local_48;
  size_t local_38;
  
  pbVar3 = (bool *)Utils::getUtf8Character((this->m_test_case).m_character);
  if (FRAGMENT_SHADER < in_stage) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0xf29);
LAB_009d4d2f:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  CVar1 = (this->m_test_case).m_case;
  if (DEBUG_CASE < CVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0xf3e);
    goto LAB_009d4d2f;
  }
  pcVar4 = (&PTR_anon_var_dwarf_5b343f_020dcc88)[in_stage];
  text = glcts::fixed_sample_locations_values + 1;
  switch(CVar1) {
  case IN_COMMENT:
    local_50 = pbVar3;
    break;
  case IN_PREPROCESSOR:
    local_50 = glcts::fixed_sample_locations_values + 1;
    local_48 = pbVar3;
    goto LAB_009d4c5a;
  default:
    local_50 = glcts::fixed_sample_locations_values + 1;
    local_48 = glcts::fixed_sample_locations_values + 1;
    text = pbVar3;
    goto LAB_009d4c5a;
  case DEBUG_CASE:
    local_50 = glcts::fixed_sample_locations_values + 1;
  }
  local_48 = glcts::fixed_sample_locations_values + 1;
LAB_009d4c5a:
  psVar2 = (out_source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (char *)(psVar2->m_code)._M_string_length;
  strlen(pcVar4);
  std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar5,(ulong)pcVar4);
  local_38 = 0;
  pcVar4 = "#version 420";
  if (in_use_version_400) {
    pcVar4 = 
    "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
    ;
  }
  pcVar5 = "#version 430";
  if (in_stage != COMPUTE_SHADER) {
    pcVar5 = pcVar4;
  }
  Utils::replaceToken("VERSION",&local_38,pcVar5,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("COMMENT_CASE",local_50,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("PREPROCESSOR_CASE",local_48,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("LAST_CHARACTER_CASE",text,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  return;
}

Assistant:

void UTF8CharactersTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
											 Utils::shaderSource& out_source)
{
	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D   uni_image;\n"
		"          uniform sampler2D uni_sampler;\n"
		"\n"
		"#if 0\n"
		"    #define SET_REPREPROCESSOR_CASESULT(XX) result = XX\n"
		"#else\n"
		"    #define SET_RESULT(XX) result = XX\n"
		"#endif\n"
		"\n"
		"void main()\n"
		"{\n"
		"    ivec2 coordinates = ivec2(gl_GlobalInvocationID.xy + ivec2(16, 16));\n"
		"    vec4  result      = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if (vec4(0, 0, 1, 1) == texelFetch(uni_sampler, coordinates, 0 /* lod */))\n"
		"    {\n"
		"        SET_RESULT(vec4(0, 1, 0, 1));\n"
		"    }\n"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"// Lorem ipsum LAST_CHARACTER_CASE";

	static const GLchar* fragment_shader_template =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"in      vec4      gs_fs_result;\n"
		"in      vec2      gs_fs_tex_coord;\n"
		"out     vec4      fs_out_result;\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"#if 0\n"
		"    #define SET_REPREPROCESSOR_CASESULT(XX) result = XX\n"
		"#else\n"
		"    #define SET_RESULT(XX) result = XX\n"
		"#endif\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((vec4(0, 0, 1, 1) == texture(uni_sampler, gs_fs_tex_coord)) &&\n"
		"        (vec4(0, 1, 0, 1) == gs_fs_result) )\n"
		"    {\n"
		"         SET_RESULT(vec4(0, 1, 0, 1));\n"
		"    }\n"
		"\n"
		"    fs_out_result = result;\n"
		"}\n"
		"// Lorem ipsum LAST_CHARACTER_CASE";

	static const GLchar* geometry_shader_template =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"layout(points)                           in;\n"
		"layout(triangle_strip, max_vertices = 4) out;\n"
		"\n"
		"in      vec4      tes_gs_result[];\n"
		"out     vec2      gs_fs_tex_coord;\n"
		"out     vec4      gs_fs_result;\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"#if 0\n"
		"    #define SET_REPREPROCESSOR_CASESULT(XX) result = XX\n"
		"#else\n"
		"    #define SET_RESULT(XX) result = XX\n"
		"#endif\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((vec4(0, 0, 1, 1) == texture(uni_sampler, vec2(0.5, 0.5))) &&\n"
		"        (vec4(0, 1, 0, 1) == tes_gs_result[0]) )\n"
		"    {\n"
		"         SET_RESULT(vec4(0, 1, 0, 1));\n"
		"    }\n"
		"\n"
		"    gs_fs_tex_coord = vec2(0.25, 0.25);\n"
		"    gs_fs_result    = result;\n"
		"    gl_Position     = vec4(-1, -1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_tex_coord = vec2(0.25, 0.75);\n"
		"    gs_fs_result    = result;\n"
		"    gl_Position     = vec4(-1, 1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_tex_coord = vec2(0.75, 0.25);\n"
		"    gs_fs_result    = result;\n"
		"    gl_Position     = vec4(1, -1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_tex_coord = vec2(0.75, 0.75);\n"
		"    gs_fs_result    = result;\n"
		"    gl_Position     = vec4(1, 1, 0, 1);\n"
		"    EmitVertex();\n"
		"}\n"
		"// Lorem ipsum LAST_CHARACTER_CASE";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in      vec4      vs_tcs_result[];\n"
		"out     vec4      tcs_tes_result[];\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"#if 0\n"
		"    #define SET_REPREPROCESSOR_CASESULT(XX) result = XX\n"
		"#else\n"
		"    #define SET_RESULT(XX) result = XX\n"
		"#endif\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((vec4(0, 0, 1, 1) == texture(uni_sampler, vec2(0.4, 0.4))) &&\n"
		"        (vec4(0, 1, 0, 1) == vs_tcs_result[gl_InvocationID]) )\n"
		"    {\n"
		"         SET_RESULT(vec4(0, 1, 0, 1));\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"// Lorem ipsum LAST_CHARACTER_CASE";

	static const GLchar* tess_eval_shader_template =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"layout(isolines, point_mode) in;\n"
		"\n"
		"in      vec4      tcs_tes_result[];\n"
		"out     vec4      tes_gs_result;\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"#if 0\n"
		"    #define SET_REPREPROCESSOR_CASESULT(XX) result = XX\n"
		"#else\n"
		"    #define SET_RESULT(XX) result = XX\n"
		"#endif\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((vec4(0, 0, 1, 1) == texture(uni_sampler, vec2(0.6, 0.6))) &&\n"
		"        (vec4(0, 1, 0, 1) == tcs_tes_result[0]) )\n"
		"    {\n"
		"         SET_RESULT(vec4(0, 1, 0, 1));\n"
		"    }\n"
		"\n"
		"    tes_gs_result = result;\n"
		"}\n"
		"// Lorem ipsum LAST_CHARACTER_CASE";

	static const GLchar* vertex_shader_template =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"out     vec4      vs_tcs_result;\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"#if 0\n"
		"    #define SET_REPREPROCESSOR_CASESULT(XX) result = XX\n"
		"#else\n"
		"    #define SET_RESULT(XX) result = XX\n"
		"#endif\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if (vec4(0, 0, 1, 1) == texture(uni_sampler, vec2(0.5, 0.5)) )\n"
		"    {\n"
		"         SET_RESULT(vec4(0, 1, 0, 1));\n"
		"    }\n"
		"\n"
		"    vs_tcs_result = result;\n"
		"}\n"
		"// Lorem ipsum LAST_CHARACTER_CASE";

	const GLchar* shader_template	 = 0;
	const GLchar* comment_case		  = "";
	const GLchar* preprocessor_case   = "";
	const GLchar* last_character_case = "";
	const GLchar* utf8_character	  = Utils::getUtf8Character(m_test_case.m_character);

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	switch (m_test_case.m_case)
	{
	case IN_COMMENT:
		comment_case = utf8_character;
		break;
	case IN_PREPROCESSOR:
		preprocessor_case = utf8_character;
		break;
	case AS_LAST_CHARACTER_NULL_TERMINATED:
		last_character_case = utf8_character;
		break;
	case AS_LAST_CHARACTER_NON_NULL_TERMINATED:
		last_character_case = utf8_character;
		break;
	case DEBUG_CASE:
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("COMMENT_CASE", comment_case, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("PREPROCESSOR_CASE", preprocessor_case, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("LAST_CHARACTER_CASE", last_character_case, out_source.m_parts[0].m_code);
}